

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Matrix<double,_3,_3>_>::call
          (unary<double,_tcu::Matrix<double,_3,_3>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  Matrix<double,_3,_3> arg;
  undefined8 local_58 [10];
  long lVar7;
  
  puVar1 = local_58;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[8] = 0;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar6 = _DAT_019f34d0;
    do {
      bVar8 = SUB164(auVar6 ^ _DAT_019ec5b0,4) == DAT_01a3c1d0._4_4_ &&
              SUB164(auVar6 ^ _DAT_019ec5b0,0) < DAT_01a3c1d0;
      if (bVar8) {
        uVar5 = 0x3ff0000000000000;
        if (lVar2 != lVar4) {
          uVar5 = 0;
        }
        *(undefined8 *)((long)puVar1 + lVar4) = uVar5;
      }
      if (bVar8) {
        uVar5 = 0x3ff0000000000000;
        if (lVar2 + -0x18 != lVar4) {
          uVar5 = 0;
        }
        *(undefined8 *)((long)puVar1 + lVar4 + 0x18) = uVar5;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x30;
    } while (lVar4 != 0x60);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x18;
    puVar1 = (undefined8 *)((long)puVar1 + 8);
  } while (lVar3 != 3);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_58 + lVar2 + 0x10) =
         *(undefined8 *)((long)argument_src + lVar2 + 0x10);
    uVar5 = ((undefined8 *)((long)argument_src + lVar2))[1];
    *(undefined8 *)((long)local_58 + lVar2) = *(undefined8 *)((long)argument_src + lVar2);
    *(undefined8 *)((long)local_58 + lVar2 + 8) = uVar5;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  uVar5 = (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(local_58);
  *(undefined8 *)result_dst = uVar5;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}